

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

bool xercesc_4_0::XMLUri::processPath
               (XMLCh *pathStr,XMLSize_t pathStrLen,bool isSchemePresent,bool bAllowSpaces)

{
  XMLCh XVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  undefined1 *toSearch;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  if (pathStrLen == 0) {
    return true;
  }
  bVar7 = true;
  if (isSchemePresent) {
    bVar7 = *pathStr == L'/';
  }
  uVar5 = 0;
  do {
    XVar1 = pathStr[uVar5];
    uVar6 = uVar5;
    if ((ushort)XVar1 < 0x25) {
      if (XVar1 == L' ') {
        if (!bAllowSpaces) {
          return false;
        }
      }
      else {
        if (XVar1 == L'#') break;
LAB_002557cf:
        bVar2 = XMLString::isAlphaNum(XVar1);
        if ((!bVar2) && (iVar3 = XMLString::indexOf((XMLCh *)MARK_CHARACTERS,XVar1), iVar3 == -1)) {
          if (bVar7) {
            toSearch = PATH_CHARACTERS;
          }
          else {
            toSearch = RESERVED_CHARACTERS;
          }
          iVar3 = XMLString::indexOf((XMLCh *)toSearch,XVar1);
          if (iVar3 == -1) {
            return false;
          }
        }
      }
    }
    else {
      if (XVar1 != L'%') {
        if (XVar1 != L'?') goto LAB_002557cf;
        break;
      }
      if (pathStrLen <= uVar5 + 2) {
        return false;
      }
      bVar2 = XMLString::isHex(pathStr[uVar5 + 1]);
      if (!bVar2) {
        return false;
      }
      bVar2 = XMLString::isHex(pathStr[uVar5 + 2]);
      if (!bVar2) {
        return false;
      }
    }
    uVar5 = uVar5 + 1;
    uVar6 = pathStrLen;
  } while (pathStrLen != uVar5);
  if (((XVar1 == L'?') || (XVar1 == L'#')) && (uVar6 + 1 < pathStrLen)) {
    bVar7 = XVar1 == L'?';
    uVar5 = uVar6 + 1;
    do {
      uVar4 = uVar5;
      XVar1 = pathStr[uVar4];
      if (XVar1 == L' ') {
        if (!bAllowSpaces) {
          return false;
        }
      }
      else if (XVar1 == L'%') {
        if (pathStrLen <= uVar6 + 3) {
          return false;
        }
        bVar2 = XMLString::isHex(pathStr[uVar6 + 2]);
        if (!bVar2) {
          return false;
        }
        bVar2 = XMLString::isHex(pathStr[uVar6 + 3]);
        if (!bVar2) {
          return false;
        }
      }
      else if ((XVar1 == L'#') && (bVar7)) {
        bVar7 = false;
      }
      else {
        bVar2 = XMLString::isAlphaNum(XVar1);
        if ((!bVar2) &&
           (iVar3 = XMLString::indexOf((XMLCh *)MARK_OR_RESERVED_CHARACTERS,XVar1), iVar3 == -1)) {
          return false;
        }
      }
      uVar5 = uVar4 + 1;
      uVar6 = uVar4;
    } while (uVar4 + 1 < pathStrLen);
  }
  return true;
}

Assistant:

bool XMLUri::processPath(const XMLCh* const pathStr,
                         const XMLSize_t pathStrLen,
                         const bool isSchemePresent,
                         const bool bAllowSpaces/*=false*/)
{
    if (pathStrLen != 0)
    {
        XMLSize_t index = 0;
        XMLCh testChar = chNull;
        bool isOpaque = (!isSchemePresent || *pathStr == chForwardSlash);

        // path - everything up to query string or fragment
        //
        // RFC 2732 only allows '[' and ']' to appear in the opaque part.
        while (index < pathStrLen)
        {
            testChar = pathStr[index];
            if (testChar == chQuestion || testChar == chPound)
                break;

            if (testChar == chPercent)
            {
                if (index+2 >= pathStrLen ||
                    !XMLString::isHex(pathStr[index+1]) ||
                    !XMLString::isHex(pathStr[index+2]))
                        return false;
            }
            else if (testChar==chSpace)
            {
                if(!bAllowSpaces)
                    return false;
            }
            else if (!isUnreservedCharacter(testChar) &&
                     ((isOpaque && !isPathCharacter(testChar)) ||
                      (!isOpaque && !isReservedCharacter(testChar))))
            {
                return false;
            }

            index++;
        }

        // query - starts with ? and up to fragment or end
        // fragment - starts with #
        bool isQuery = (testChar == chQuestion);
        if (isQuery || testChar == chPound)
        {
            index++;
            while (index < pathStrLen)
            {
                testChar = pathStr[index];
                if (testChar == chPound && isQuery) {
                    isQuery = false;
                    index++;
                    continue;
                }

                if (testChar == chPercent)
                {
                    if (index+2 >= pathStrLen ||
                        !XMLString::isHex(pathStr[index+1]) ||
                        !XMLString::isHex(pathStr[index+2]))
                        return false;
                }
                else if (testChar==chSpace)
                {
                    if(!bAllowSpaces)
                        return false;
                }
                else if (!isReservedOrUnreservedCharacter(testChar))
                {
                    return false;
                }
                index++;
            }
        }
    } //if (pathStrLen...)

    return true;
}